

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

uint32_t cache_numbits(io_buf *buf,int filepointer)

{
  undefined1 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  undefined4 in_ESI;
  long *in_RDI;
  uint32_t cache_numbits;
  stringstream __msg_3;
  stringstream __msg_2;
  char temp;
  version_struct v_tmp;
  vector<char,_std::allocator<char>_> t;
  stringstream __msg_1;
  stringstream __msg;
  size_t v_length;
  char *in_stack_fffffffffffff878;
  version_struct *in_stack_fffffffffffff880;
  version_struct *in_stack_fffffffffffff888;
  version_struct *in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89f;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff8a0;
  int iVar6;
  long *plVar5;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  undefined4 uVar7;
  vw_exception *in_stack_fffffffffffff8b0;
  vw_exception *this;
  uint32_t local_730;
  undefined1 local_729;
  stringstream local_708 [16];
  ostream local_6f8;
  undefined1 local_579;
  stringstream local_558 [16];
  ostream local_548;
  char local_3c9;
  int local_3c8;
  version_struct local_3c4 [2];
  allocator<char> local_3a9 [32];
  undefined1 local_389;
  stringstream local_368 [16];
  ostream local_358;
  undefined1 local_1d9;
  stringstream local_1b8 [16];
  ostream local_1a8;
  vw_exception *local_20;
  undefined4 local_14;
  long *local_10;
  uint32_t local_4;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  (**(code **)(*in_RDI + 0x28))(in_RDI,in_ESI,&local_20,8);
  if ((vw_exception *)0x3d < local_20) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    iVar6 = (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20);
    std::operator<<(&local_1a8,"cache version too long, cache file is probably invalid");
    local_1d9 = 1;
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffff8b0,
               (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),iVar6,
               (string *)CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
    local_1d9 = 0;
    __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (local_20 == (vw_exception *)0x0) {
    std::__cxx11::stringstream::stringstream(local_368);
    iVar6 = (int)((ulong)in_stack_fffffffffffff8a0 >> 0x20);
    std::operator<<(&local_358,"cache version too short, cache file is probably invalid");
    local_389 = 1;
    uVar2 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffff8b0,
               (char *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),iVar6,
               (string *)CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898));
    local_389 = 0;
    __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  this = local_20;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffff8a0,CONCAT17(in_stack_fffffffffffff89f,in_stack_fffffffffffff898)
             ,(allocator_type *)in_stack_fffffffffffff890);
  std::allocator<char>::~allocator(local_3a9);
  plVar5 = local_10;
  uVar7 = local_14;
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x25bcdc);
  (**(code **)(*plVar5 + 0x28))(plVar5,uVar7,pcVar3,local_20);
  iVar6 = (int)((ulong)plVar5 >> 0x20);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x25bd08);
  version_struct::version_struct(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  version_struct::version_struct(local_3c4,&version);
  uVar1 = version_struct::operator!=(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  if ((bool)uVar1) {
    local_4 = 0;
    local_3c8 = 1;
  }
  else {
    in_stack_fffffffffffff890 =
         (version_struct *)(**(code **)(*local_10 + 0x28))(local_10,local_14,&local_3c9,1);
    if ((long)in_stack_fffffffffffff890 < 1) {
      std::__cxx11::stringstream::stringstream(local_558);
      std::operator<<(&local_548,"failed to read");
      local_579 = 1;
      uVar2 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (this,(char *)CONCAT44(uVar7,in_stack_fffffffffffff8a8),iVar6,
                 (string *)CONCAT17(uVar1,in_stack_fffffffffffff898));
      local_579 = 0;
      __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (local_3c9 != 'c') {
      std::__cxx11::stringstream::stringstream(local_708);
      std::operator<<(&local_6f8,"data file is not a cache file");
      local_729 = 1;
      uVar2 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (this,(char *)CONCAT44(uVar7,in_stack_fffffffffffff8a8),iVar6,
                 (string *)CONCAT17(uVar1,in_stack_fffffffffffff898));
      local_729 = 0;
      __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_3c8 = 0;
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff890);
  if (local_3c8 == 0) {
    lVar4 = (**(code **)(*local_10 + 0x28))(local_10,local_14,&local_730,4);
    if (lVar4 < 4) {
      local_4 = 1;
    }
    else {
      local_4 = local_730;
    }
  }
  return local_4;
}

Assistant:

uint32_t cache_numbits(io_buf* buf, int filepointer)
{
  try
  {
    size_t v_length;
    buf->read_file(filepointer, (char*)&v_length, sizeof(v_length));
    if (v_length > 61)
      THROW("cache version too long, cache file is probably invalid");

    if (v_length == 0)
      THROW("cache version too short, cache file is probably invalid");

    std::vector<char> t(v_length);
    buf->read_file(filepointer, t.data(), v_length);
    version_struct v_tmp(t.data());
    if (v_tmp != version)
    {
      //      cout << "cache has possibly incompatible version, rebuilding" << endl;
      return 0;
    }

    char temp;
    if (buf->read_file(filepointer, &temp, 1) < 1)
      THROW("failed to read");

    if (temp != 'c')
      THROW("data file is not a cache file");
  }
  catch (...)
  {
    // TODO fix this exception bubbling behavior: https://github.com/VowpalWabbit/vowpal_wabbit/issues/1774
    // Prior to using a std::vector, a v_array was used and the catch statement was used to delete it.
    // This caused any exception to be ignored. Bubbling up this exception causes tests to fail so
    // I am going to swallow it to maintain previous behavior.
  }

  uint32_t cache_numbits;
  if (buf->read_file(filepointer, &cache_numbits, sizeof(cache_numbits)) < (int)sizeof(cache_numbits))
  {
    return true;
  }

  return cache_numbits;
}